

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O2

string * __thiscall
BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::LogMsg
          (string *__return_storage_ptr__,
          Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *this,string *msg)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  double *in_R9;
  long in_FS_OFFSET;
  _Alloc_hider local_28;
  size_type local_20;
  
  local_20 = *(size_type *)(in_FS_OFFSET + 0x28);
  lVar1 = std::chrono::_V2::steady_clock::now();
  if ((this->m_start_t).
      super__Optional_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
      ._M_engaged == false) {
    if (*(size_type *)(in_FS_OFFSET + 0x28) == local_20) {
      tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                (__return_storage_ptr__,(tinyformat *)0xb46df7,(char *)&this->m_prefix,msg,in_R8);
      return __return_storage_ptr__;
    }
  }
  else {
    local_28._M_p =
         (pointer)((double)(lVar1 - (long)(this->m_start_t).
                                          super__Optional_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true,_true>
                                          ._M_payload.
                                          super__Optional_payload_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                                          ._M_payload) / 1000000.0);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string,double>
              (__return_storage_ptr__,(tinyformat *)"%s: %s (%.2fms)",(char *)&this->m_prefix,msg,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28,in_R9)
    ;
    if (*(size_type *)(in_FS_OFFSET + 0x28) == local_20) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

std::string LogMsg(const std::string& msg)
    {
        const auto end_time{std::chrono::steady_clock::now()};
        if (!m_start_t) {
            return strprintf("%s: %s", m_prefix, msg);
        }
        const auto duration{end_time - *m_start_t};

        if constexpr (std::is_same<TimeType, std::chrono::microseconds>::value) {
            return strprintf("%s: %s (%iμs)", m_prefix, msg, Ticks<std::chrono::microseconds>(duration));
        } else if constexpr (std::is_same<TimeType, std::chrono::milliseconds>::value) {
            return strprintf("%s: %s (%.2fms)", m_prefix, msg, Ticks<MillisecondsDouble>(duration));
        } else if constexpr (std::is_same<TimeType, std::chrono::seconds>::value) {
            return strprintf("%s: %s (%.2fs)", m_prefix, msg, Ticks<SecondsDouble>(duration));
        } else {
            static_assert(ALWAYS_FALSE<TimeType>, "Error: unexpected time type");
        }
    }